

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumberObject.cpp
# Opt level: O1

void __thiscall
Js::JavascriptNumberObject::JavascriptNumberObject
          (JavascriptNumberObject *this,Var value,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01543150;
  Memory::Recycler::WBSetBit((char *)&this->value);
  (this->value).ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->value);
  if ((type->super_Type).typeId != TypeIds_NumberObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumberObject.cpp"
                                ,0x12,"(type->GetTypeId() == TypeIds_NumberObject)",
                                "type->GetTypeId() == TypeIds_NumberObject");
    if (!bVar2) goto LAB_00ced9f3;
    *puVar4 = 0;
  }
  uVar5 = (ulong)value & 0xffff000000000000;
  bVar2 = ((ulong)value & 0x1ffff00000000) != 0x1000000000000;
  if (bVar2 && uVar5 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00ced9f3;
    *puVar4 = 0;
  }
  if ((ulong)value >> 0x32 == 0 && uVar5 != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumberObject.cpp"
                                ,0x13,"(TaggedInt::Is(value) || JavascriptNumber::Is(value))",
                                "TaggedInt::Is(value) || JavascriptNumber::Is(value)");
    if (!bVar3) goto LAB_00ced9f3;
    *puVar4 = 0;
  }
  if (bVar2 && uVar5 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ced9f3;
    *puVar4 = 0;
  }
  if (uVar5 != 0x1000000000000) {
    bVar2 = ThreadContext::IsOnStack(value);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumberObject.cpp"
                                  ,0x14,"(TaggedInt::Is(value) || !ThreadContext::IsOnStack(value))"
                                  ,"TaggedInt::Is(value) || !ThreadContext::IsOnStack(value)");
      if (!bVar2) {
LAB_00ced9f3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

JavascriptNumberObject::JavascriptNumberObject(Var value, DynamicType * type)
        : DynamicObject(type), value(value)
    {
        Assert(type->GetTypeId() == TypeIds_NumberObject);
        Assert(TaggedInt::Is(value) || JavascriptNumber::Is(value));
        Assert(TaggedInt::Is(value) || !ThreadContext::IsOnStack(value));
    }